

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O3

void __thiscall ProcessProgress::heartbeat(ProcessProgress *this)

{
  int iVar1;
  itimerspec spec;
  itimerspec local_28;
  
  if (-1 < this->watchdog_timer_fd) {
    this->heartbeats = this->heartbeats + 1;
    local_28.it_value.tv_nsec = 0;
    local_28.it_interval.tv_sec = 0;
    local_28.it_interval.tv_nsec = 0;
    local_28.it_value.tv_sec = 10;
    iVar1 = timerfd_settime(this->watchdog_timer_fd,0,&local_28,(itimerspec *)0x0);
    if (iVar1 < 0) {
      heartbeat();
    }
  }
  return;
}

Assistant:

void ProcessProgress::heartbeat()
{
	if (watchdog_timer_fd >= 0)
	{
		heartbeats++;
		// Rearm timer
		struct itimerspec spec = {};
		spec.it_value.tv_sec = 10;
		if (timerfd_settime(watchdog_timer_fd, 0, &spec, nullptr) < 0)
			LOGE("Failed to set time with timerfd_settime.\n");
	}
}